

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLFormatter.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLFormatter::XMLFormatter
          (XMLFormatter *this,XMLCh *outEncoding,XMLCh *docVersion,XMLFormatTarget *target,
          EscapeFlags escapeFlags,UnRepFlags unrepFlags,MemoryManager *manager)

{
  bool bVar1;
  XMLTranscoder *pXVar2;
  TranscodingException *this_00;
  XMLCh *pXVar3;
  Codes local_34;
  UnRepFlags local_30;
  Codes resCode;
  UnRepFlags unrepFlags_local;
  EscapeFlags escapeFlags_local;
  XMLFormatTarget *target_local;
  XMLCh *docVersion_local;
  XMLCh *outEncoding_local;
  XMLFormatter *this_local;
  
  local_30 = unrepFlags;
  resCode = escapeFlags;
  _unrepFlags_local = target;
  target_local = (XMLFormatTarget *)docVersion;
  docVersion_local = outEncoding;
  outEncoding_local = (XMLCh *)this;
  XMemory::XMemory((XMemory *)this);
  this->fEscapeFlags = resCode;
  this->fOutEncoding = (XMLCh *)0x0;
  this->fTarget = _unrepFlags_local;
  this->fUnRepFlags = local_30;
  this->fXCoder = (XMLTranscoder *)0x0;
  this->fAposRef = (XMLByte *)0x0;
  this->fAposLen = 0;
  this->fAmpRef = (XMLByte *)0x0;
  this->fAmpLen = 0;
  this->fGTRef = (XMLByte *)0x0;
  this->fGTLen = 0;
  this->fLTRef = (XMLByte *)0x0;
  this->fLTLen = 0;
  this->fQuoteRef = (XMLByte *)0x0;
  this->fQuoteLen = 0;
  this->fIsXML11 = false;
  this->fMemoryManager = manager;
  pXVar2 = XMLTransService::makeNewTranscoderFor
                     (XMLPlatformUtils::fgTransService,docVersion_local,&local_34,0x4000,
                      this->fMemoryManager);
  this->fXCoder = pXVar2;
  if (this->fXCoder == (XMLTranscoder *)0x0) {
    this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
    TranscodingException::TranscodingException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/framework/XMLFormatter.cpp"
               ,0xee,Trans_CantCreateCvtrFor,docVersion_local,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0
               ,this->fMemoryManager);
    __cxa_throw(this_00,&TranscodingException::typeinfo,TranscodingException::~TranscodingException)
    ;
  }
  pXVar3 = XMLString::replicate(docVersion_local,this->fMemoryManager);
  this->fOutEncoding = pXVar3;
  bVar1 = XMLString::equals((XMLCh *)target_local,L"1.1");
  this->fIsXML11 = bVar1;
  return;
}

Assistant:

XMLFormatter::XMLFormatter( const   XMLCh* const            outEncoding
                            , const XMLCh* const            docVersion
                            ,       XMLFormatTarget* const  target
                            , const EscapeFlags             escapeFlags
                            , const UnRepFlags              unrepFlags
                            ,       MemoryManager* const    manager)
    : fEscapeFlags(escapeFlags)
    , fOutEncoding(0)
    , fTarget(target)
    , fUnRepFlags(unrepFlags)
    , fXCoder(0)
    , fAposRef(0)
    , fAposLen(0)
    , fAmpRef(0)
    , fAmpLen(0)
    , fGTRef(0)
    , fGTLen(0)
    , fLTRef(0)
    , fLTLen(0)
    , fQuoteRef(0)
    , fQuoteLen(0)
    , fIsXML11(false)
    , fMemoryManager(manager)
{
    // Try to create a transcoder for this encoding
    XMLTransService::Codes resCode;
    fXCoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
    (
        outEncoding
        , resCode
        , kTmpBufSize
        , fMemoryManager
    );

    if (!fXCoder)
    {
        ThrowXMLwithMemMgr1
        (
            TranscodingException
            , XMLExcepts::Trans_CantCreateCvtrFor
            , outEncoding
            , fMemoryManager
        );
    }

    // Copy the encoding string
    fOutEncoding = XMLString::replicate(outEncoding, fMemoryManager);

    fIsXML11 = XMLString::equals(docVersion, XMLUni::fgVersion1_1);
}